

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall helics::FilterFederate::clearTimeReturn(FilterFederate *this,int32_t id)

{
  bool bVar1;
  reference pvVar2;
  reference ppVar3;
  int in_ESI;
  _Deque_iterator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_&,_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*>
  *in_RDI;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *tBP;
  iterator __end2;
  iterator __begin2;
  deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *__range2;
  bool recheckTime;
  deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *in_stack_ffffffffffffff88;
  deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffb7;
  TimeCoordinator *in_stack_ffffffffffffffb8;
  Time in_stack_ffffffffffffffc0;
  _Self local_38;
  _Elt_pointer *local_18;
  byte local_d;
  int local_c;
  
  local_c = in_ESI;
  bVar1 = std::
          deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
          ::empty((deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                   *)0x641a93);
  if (!bVar1) {
    local_d = 0;
    pvVar2 = std::
             deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
             ::front(in_stack_ffffffffffffffa0);
    if (pvVar2->first == local_c) {
      pvVar2 = std::
               deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
               ::front(in_stack_ffffffffffffffa0);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                        (&pvVar2->second,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x20)
                        );
      if (bVar1) {
        local_d = 1;
      }
      std::
      deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
      ::pop_front((deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                   *)in_RDI);
    }
    if ((local_d & 1) != 0) {
      in_RDI[0x20]._M_cur = (_Elt_pointer)0x7fffffffffffffff;
      local_18 = &in_RDI[0x1d]._M_last;
      std::
      deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
      ::begin(in_stack_ffffffffffffff88);
      std::
      deque<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
      ::end(in_stack_ffffffffffffff88);
      while (bVar1 = std::operator==(&local_38,(_Self *)&stack0xffffffffffffffa8),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        ppVar3 = std::
                 _Deque_iterator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_&,_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*>
                 ::operator*(&local_38);
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          (&ppVar3->second,
                           (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x20));
        if (bVar1) {
          in_RDI[0x20]._M_cur = (_Elt_pointer)(ppVar3->second).internalTimeCode;
        }
        std::
        _Deque_iterator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_&,_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*>
        ::operator++(in_RDI);
      }
      TimeCoordinator::updateMessageTime
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffb7
                );
    }
  }
  return;
}

Assistant:

void FilterFederate::clearTimeReturn(int32_t id)
{
    if (timeBlockProcesses.empty()) {
        return;
    }
    bool recheckTime = false;
    if (timeBlockProcesses.front().first == id) {
        if (timeBlockProcesses.front().second == minReturnTime) {
            recheckTime = true;
        }
        timeBlockProcesses.pop_front();
    } else {
    }
    if (recheckTime) {
        minReturnTime = cBigTime;
        for (const auto& tBP : timeBlockProcesses) {
            if (tBP.second < minReturnTime) {
                minReturnTime = tBP.second;
            }
        }
        mCoord.updateMessageTime(minReturnTime, current_state == FederateStates::EXECUTING);
    }
}